

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImRect IVar1;
  long in_RDI;
  float fVar2;
  ImVec2 padding;
  ImGuiPlatformMonitor *monitor;
  ImGuiContext *g;
  ImRect r_screen;
  ImVec2 *in_stack_ffffffffffffff98;
  ImRect *in_stack_ffffffffffffffa0;
  ImVec2 *this;
  float local_54;
  float local_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImGuiPlatformMonitor *local_28;
  ImGuiContext *local_20;
  long local_18;
  ImRect local_10;
  
  local_20 = GImGui;
  local_18 = in_RDI;
  ImRect::ImRect(in_stack_ffffffffffffffa0);
  if (*(int *)(local_18 + 0x3c) < 0) {
    local_10.Min = *(ImVec2 *)(*(long *)(local_18 + 0x28) + 8);
    local_38 = ::operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x1c18a8);
    local_10.Max = local_38;
  }
  else {
    local_28 = ImVector<ImGuiPlatformMonitor>::operator[]
                         (&(local_20->PlatformIO).Monitors,*(int *)(local_18 + 0x3c));
    local_10.Min = local_28->WorkPos;
    local_30 = ::operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x1c186b);
    local_10.Max = local_30;
  }
  local_40 = (local_20->Style).DisplaySafeAreaPadding;
  fVar2 = ImRect::GetWidth(&local_10);
  if (fVar2 <= local_40.x * 2.0) {
    local_4c = 0.0;
  }
  else {
    local_4c = -local_40.x;
  }
  fVar2 = ImRect::GetHeight(&local_10);
  if (fVar2 <= local_40.y * 2.0) {
    local_54 = 0.0;
  }
  else {
    local_54 = -local_40.y;
  }
  this = &local_48;
  ImVec2::ImVec2(this,local_4c,local_54);
  ImRect::Expand(&local_10,this);
  IVar1.Max = local_10.Max;
  IVar1.Min = local_10.Min;
  return IVar1;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}